

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_debug_getmetatable(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  TRef TVar2;
  TRef TVar3;
  uint uVar4;
  IRRef1 IVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  GCobj *o;
  TRef TVar9;
  bool bVar10;
  
  puVar6 = J->base;
  uVar4 = *puVar6;
  uVar7 = uVar4 & 0x1f000000;
  if (uVar7 == 0xb000000) {
    IVar5 = 5;
  }
  else {
    if (uVar7 != 0xc000000) {
      uVar4 = (rd->argv->field_2).it;
      uVar8 = 0x23;
      if ((0xfffeffff < uVar4) && (uVar8 = 0x19, (uVar4 & 0xffff8000) != 0xffff0000)) {
        uVar8 = (ulong)(0x15 - uVar4);
      }
      o = (GCobj *)(ulong)*(uint *)((long)J + uVar8 * 4 + -0xb0);
      if (o == (GCobj *)0x0) {
        uVar4 = 0x7fff;
      }
      else {
        uVar4 = lj_ir_kgc(J,o,IRT_TAB);
        puVar6 = J->base;
      }
      *puVar6 = uVar4;
      return;
    }
    IVar5 = 0xb;
  }
  iVar1 = *(int *)((ulong)(rd->argv->u32).lo + 0x10);
  (J->fold).ins.field_0.ot = 0x440b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar4;
  (J->fold).ins.field_0.op2 = IVar5;
  TVar2 = lj_opt_fold(J);
  bVar10 = iVar1 != 0;
  TVar9 = 0x7fff;
  if (bVar10) {
    TVar9 = TVar2;
  }
  TVar3 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)bVar10 << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  *J->base = TVar9;
  return;
}

Assistant:

static void LJ_FASTCALL recff_debug_getmetatable(jit_State *J, RecordFFData *rd)
{
  GCtab *mt;
  TRef mtref;
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    mt = tabref(tabV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_TAB_META);
  } else if (tref_isudata(tr)) {
    mt = tabref(udataV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_UDATA_META);
  } else {
    mt = tabref(basemt_obj(J2G(J), &rd->argv[0]));
    J->base[0] = mt ? lj_ir_ktab(J, mt) : TREF_NIL;
    return;
  }
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
  J->base[0] = mt ? mtref : TREF_NIL;
}